

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

void ts_stack_iterate(Stack *self,StackVersion version,StackIterateCallback callback,void *payload)

{
  uint32_t *puVar1;
  undefined8 *puVar2;
  StackHead *self_00;
  uint32_t uVar3;
  undefined4 uVar4;
  StackNode *pSVar5;
  StackSlice *pSVar6;
  StackNode *pSVar7;
  undefined8 uVar8;
  uint32_t uVar9;
  byte bVar10;
  StackIterator *pSVar11;
  Subtree *pSVar12;
  StackIterator *pSVar13;
  uint uVar14;
  uint uVar15;
  uint extraout_EDX;
  uint extraout_EDX_00;
  SubtreeArray *pSVar16;
  ulong uVar17;
  _Bool *p_Var18;
  Subtree SVar19;
  ulong uVar20;
  Stack *self_01;
  Stack *self_02;
  uint uVar21;
  SubtreeHeapData *pSVar22;
  StackNode *pSVar23;
  uint uVar24;
  ulong uVar25;
  uint32_t uVar26;
  StackIterator current_iterator;
  byte bStack_1b9;
  undefined1 auStack_198 [16];
  undefined8 uStack_188;
  undefined8 uStack_180;
  ulong uStack_170;
  ulong uStack_168;
  ulong uStack_160;
  StackNode *pSStack_158;
  byte bStack_121;
  undefined1 auStack_f0 [16];
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  ulong uStack_d0;
  StackNode *pSStack_c8;
  
  uVar15 = 0;
  (self->slices).size = 0;
  (self->iterators).size = 0;
  if ((self->heads).size <= version) {
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x118,
                  "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)");
  }
  pSVar5 = (self->heads).contents[version].node;
  if ((self->iterators).capacity != 0) goto LAB_00130123;
  self_01 = (Stack *)(self->iterators).contents;
  if (self_01 == (Stack *)0x0) {
    self_01 = (Stack *)&DAT_00000008;
    uVar15 = 0x20;
    pSVar11 = (StackIterator *)calloc(8,0x20);
    if (pSVar11 == (StackIterator *)0x0) goto LAB_00130412;
    uVar15 = 0;
  }
  else {
    uVar15 = 0x100;
    pSVar11 = (StackIterator *)realloc(self_01,0x100);
    if (pSVar11 == (StackIterator *)0x0) {
      ts_stack_iterate_cold_1();
LAB_00130412:
      ts_stack_iterate_cold_3();
      uVar17 = 0;
      (self_01->slices).size = 0;
      (self_01->iterators).size = 0;
      pSStack_c8 = pSVar5;
      if ((self_01->heads).size <= uVar15) {
LAB_00130884:
        __assert_fail("(uint32_t)version < (&self->heads)->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                      ,0x118,
                      "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                     );
      }
      pSVar5 = (self_01->heads).contents[uVar15].node;
      if ((int)extraout_EDX < 1) {
LAB_00130478:
        pSVar12 = (Subtree *)0x0;
      }
      else {
        pSVar12 = (Subtree *)calloc((ulong)extraout_EDX,8);
        uVar17 = (ulong)extraout_EDX;
        if (pSVar12 == (Subtree *)0x0) {
          ts_stack_pop_count_cold_6();
          goto LAB_00130478;
        }
      }
      uVar21 = 0;
      if ((self_01->iterators).capacity != 0) goto LAB_001304d6;
      self_02 = (Stack *)(self_01->iterators).contents;
      if (self_02 == (Stack *)0x0) {
        self_02 = (Stack *)&DAT_00000008;
        uVar21 = 0x20;
        pSVar11 = (StackIterator *)calloc(8,0x20);
        if (pSVar11 == (StackIterator *)0x0) goto LAB_001308a8;
        uVar21 = 0;
      }
      else {
        uVar21 = 0x100;
        pSVar11 = (StackIterator *)realloc(self_02,0x100);
        if (pSVar11 == (StackIterator *)0x0) {
          ts_stack_pop_count_cold_1();
LAB_001308a8:
          ts_stack_pop_count_cold_5();
          uVar15 = 0;
          (self_02->slices).size = 0;
          (self_02->iterators).size = 0;
          uStack_160 = uVar17;
          pSStack_158 = pSVar5;
          if ((self_02->heads).size <= uVar21) {
LAB_00130cf0:
            __assert_fail("(uint32_t)version < (&self->heads)->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                          ,0x118,
                          "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                         );
          }
          pSVar5 = (self_02->heads).contents[uVar21].node;
          if ((self_02->iterators).capacity == 0) {
            pSVar11 = (self_02->iterators).contents;
            if (pSVar11 == (StackIterator *)0x0) {
              pSVar11 = (StackIterator *)&DAT_00000008;
              uVar15 = 0x20;
              pSVar13 = (StackIterator *)calloc(8,0x20);
              if (pSVar13 == (StackIterator *)0x0) goto LAB_00130d14;
              uVar15 = 0;
            }
            else {
              uVar15 = 0x100;
              pSVar13 = (StackIterator *)realloc(pSVar11,0x100);
              if (pSVar13 == (StackIterator *)0x0) {
                ts_stack_pop_pending_cold_1();
LAB_00130d14:
                ts_stack_pop_pending_cold_5();
                if (uVar15 != extraout_EDX_00) {
                  if (uVar15 <= extraout_EDX_00) {
                    __assert_fail("v2 < v1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                  ,0x265,
                                  "void ts_stack_renumber_version(Stack *, StackVersion, StackVersion)"
                                 );
                  }
                  if (*(uint *)&(pSVar11->subtrees).contents <= uVar15) {
                    __assert_fail("(uint32_t)v1 < self->heads.size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                  ,0x266,
                                  "void ts_stack_renumber_version(Stack *, StackVersion, StackVersion)"
                                 );
                  }
                  puVar2 = (undefined8 *)((long)pSVar11->node->links + (ulong)uVar15 * 0x28 + -0x10)
                  ;
                  self_00 = (StackHead *)
                            ((long)pSVar11->node->links + (ulong)extraout_EDX_00 * 0x28 + -0x10);
                  if ((self_00->summary != (StackSummary *)0x0) && (puVar2[2] == 0)) {
                    puVar2[2] = self_00->summary;
                    self_00->summary = (StackSummary *)0x0;
                  }
                  stack_head_delete(self_00,(StackNodeArray *)&pSVar11[1].subtrees.size,
                                    (SubtreePool *)&(pSVar11[2].subtrees.contents)->data);
                  *(undefined8 *)&self_00->status = puVar2[4];
                  pSVar5 = (StackNode *)*puVar2;
                  SVar19 = *(Subtree *)(puVar2 + 1);
                  uVar8 = puVar2[3];
                  self_00->summary = (StackSummary *)puVar2[2];
                  self_00->node_count_at_last_error = (int)uVar8;
                  self_00->lookahead_when_paused = (short)((ulong)uVar8 >> 0x20);
                  *(short *)&self_00->field_0x1e = (short)((ulong)uVar8 >> 0x30);
                  self_00->node = pSVar5;
                  self_00->last_external_token = SVar19;
                  uVar21 = *(uint *)&(pSVar11->subtrees).contents;
                  if (uVar21 <= uVar15) {
                    __assert_fail("index < self->size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                                  ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
                  }
                  memmove((void *)((long)pSVar11->node->links + (ulong)uVar15 * 0x28 + -0x10),
                          (void *)((long)pSVar11->node->links + (ulong)(uVar15 + 1) * 0x28 + -0x10),
                          (ulong)(uVar21 + ~uVar15) * 0x28);
                  *(int *)&(pSVar11->subtrees).contents = *(int *)&(pSVar11->subtrees).contents + -1
                  ;
                }
                return;
              }
              uVar15 = (self_02->iterators).size;
            }
            (self_02->iterators).contents = pSVar13;
            (self_02->iterators).capacity = 8;
          }
          pSVar11 = (self_02->iterators).contents;
          (self_02->iterators).size = uVar15 + 1;
          pSVar11[uVar15].node = pSVar5;
          pSVar16 = &pSVar11[uVar15].subtrees;
          pSVar16->contents = (Subtree *)0x0;
          pSVar16->size = 0;
          pSVar16->capacity = 0;
          pSVar11[uVar15].subtree_count = 0;
          pSVar11[uVar15].is_pending = true;
          uVar26 = (self_02->iterators).size;
          if (uVar26 != 0) {
            uVar17 = 0;
            do {
              do {
                pSVar11 = (self_02->iterators).contents;
                pSVar5 = pSVar11[uVar17].node;
                if (pSVar11[uVar17].subtree_count == 0) {
                  uVar20 = (ulong)pSVar5->link_count;
                  if (pSVar5->link_count == 0) goto LAB_00130bff;
                  p_Var18 = &pSVar5->links[1].is_pending;
                  uVar25 = 0;
                  uStack_168 = uVar17;
                  do {
                    uVar25 = uVar25 + 1;
                    if (uVar25 == uVar20) {
                      pSVar23 = pSVar5->links[0].node;
                      SVar19 = pSVar5->links[0].subtree;
                      bStack_1b9 = pSVar5->links[0].is_pending;
                      pSVar11 = (self_02->iterators).contents + uVar17;
LAB_00130b08:
                      pSVar11->node = pSVar23;
                      if (SVar19.ptr == (SubtreeHeapData *)0x0) {
                        pSVar11->subtree_count = pSVar11->subtree_count + 1;
                      }
                      else {
                        uVar15 = (pSVar11->subtrees).size;
                        if (uVar15 == (pSVar11->subtrees).capacity) {
                          uVar14 = uVar15 * 2;
                          if (uVar14 < 9) {
                            uVar14 = 8;
                          }
                          pSVar12 = (pSVar11->subtrees).contents;
                          if (uVar15 < uVar14) {
                            uVar20 = (ulong)uVar14;
                            if (pSVar12 == (Subtree *)0x0) {
                              uStack_170 = uVar20;
                              pSVar12 = (Subtree *)calloc(uVar20,8);
                              if (pSVar12 == (Subtree *)0x0) goto LAB_00130ce6;
                            }
                            else {
                              pSVar12 = (Subtree *)realloc(pSVar12,uVar20 << 3);
                              if (pSVar12 == (Subtree *)0x0) {
                                ts_stack_pop_pending_cold_3();
LAB_00130ce6:
                                ts_stack_pop_pending_cold_4();
                                goto LAB_00130cf0;
                              }
                              uVar15 = (pSVar11->subtrees).size;
                            }
                            (pSVar11->subtrees).contents = pSVar12;
                            (pSVar11->subtrees).capacity = uVar14;
                          }
                        }
                        else {
                          pSVar12 = (pSVar11->subtrees).contents;
                        }
                        (pSVar11->subtrees).size = uVar15 + 1;
                        pSVar12[uVar15] = SVar19;
                        ts_subtree_retain(SVar19);
                        if (((ulong)SVar19.ptr & 1) == 0) {
                          uVar15 = *(uint *)&(SVar19.ptr)->field_0x2c >> 2;
                        }
                        else {
                          uVar15 = (uint)((ulong)SVar19.ptr >> 3) & 0x1fffffff;
                        }
                        if (((uVar15 & 1) != 0) ||
                           (pSVar11->subtree_count = pSVar11->subtree_count + 1,
                           (bStack_1b9 & 1) != 0)) goto LAB_00130bd8;
                      }
                      pSVar11->is_pending = false;
                    }
                    else {
                      uVar15 = (self_02->iterators).size;
                      if (uVar15 < 0x40) {
                        pSVar23 = ((StackLink *)(p_Var18 + -0x10))->node;
                        SVar19 = *(Subtree *)(p_Var18 + -8);
                        bStack_1b9 = *p_Var18;
                        pSVar11 = (self_02->iterators).contents;
                        auStack_198._0_8_ = pSVar11[uVar17].node;
                        auStack_198._8_8_ = pSVar11[uVar17].subtrees.contents;
                        pSVar16 = &pSVar11[uVar17].subtrees;
                        uStack_188._0_4_ = pSVar16->size;
                        uStack_188._4_4_ = pSVar16->capacity;
                        uStack_180 = pSVar16[1].contents;
                        if (uVar15 == (self_02->iterators).capacity) {
                          uVar15 = uVar15 * 2;
                          if (uVar15 < 9) {
                            uVar15 = 8;
                          }
                          pSVar11 = (StackIterator *)realloc(pSVar11,(ulong)(uVar15 << 5));
                          if (pSVar11 == (StackIterator *)0x0) {
                            ts_stack_pop_pending_cold_2();
                            goto LAB_00130cbf;
                          }
                          (self_02->iterators).contents = pSVar11;
                          (self_02->iterators).capacity = uVar15;
                          uVar15 = (self_02->iterators).size;
                        }
                        (self_02->iterators).size = uVar15 + 1;
                        pSVar16 = &pSVar11[uVar15].subtrees;
                        pSVar16->size = (undefined4)uStack_188;
                        pSVar16->capacity = uStack_188._4_4_;
                        pSVar16[1].contents = uStack_180;
                        pSVar11[uVar15].node = (StackNode *)auStack_198._0_8_;
                        pSVar11[uVar15].subtrees.contents = (Subtree *)auStack_198._8_8_;
                        uVar3 = (self_02->iterators).size;
                        if (uVar3 == 0) {
                          __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                        ,0x151,
                                        "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                                       );
                        }
                        uVar15 = uVar3 - 1;
                        pSVar13 = (self_02->iterators).contents;
                        pSVar11 = pSVar13 + uVar15;
                        pSVar16 = &pSVar13[uVar15].subtrees;
                        ts_subtree_array_copy(*pSVar16,pSVar16);
                        goto LAB_00130b08;
                      }
                    }
LAB_00130bd8:
                    uVar20 = (ulong)pSVar5->link_count;
                    p_Var18 = p_Var18 + 0x18;
                  } while (uVar25 < uVar20);
                  uVar17 = (ulong)((int)uStack_168 + 1);
                }
                else {
                  if (pSVar11[uVar17].is_pending == true) {
                    auStack_198._0_8_ = pSVar11[uVar17].subtrees.contents;
                    pSVar12 = *(Subtree **)&pSVar11[uVar17].subtrees.size;
                    auStack_198._8_4_ = SUB84(pSVar12,0);
                    if (1 < (uint)auStack_198._8_4_) {
                      uVar15 = (uint)auStack_198._8_4_ >> 1;
                      uVar20 = 0;
                      do {
                        auStack_198._8_4_ = auStack_198._8_4_ - 1;
                        SVar19 = *(Subtree *)(auStack_198._0_8_ + uVar20 * 8);
                        *(Subtree *)(auStack_198._0_8_ + uVar20 * 8) =
                             *(Subtree *)(auStack_198._0_8_ + (ulong)(uint)auStack_198._8_4_ * 8);
                        *(Subtree *)(auStack_198._0_8_ + (ulong)(uint)auStack_198._8_4_ * 8) =
                             SVar19;
                        uVar20 = uVar20 + 1;
                      } while (uVar15 != uVar20);
                    }
                    auStack_198._8_8_ = pSVar12;
                    ts_stack__add_slice(self_02,uVar21,pSVar5,(SubtreeArray *)auStack_198);
                  }
                  else {
LAB_00130bff:
                    ts_subtree_array_delete(self_02->subtree_pool,&pSVar11[uVar17].subtrees);
                  }
                  uVar15 = (self_02->iterators).size;
                  if (uVar15 <= (uint)uVar17) {
LAB_00130cbf:
                    __assert_fail("index < self->size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                                  ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
                  }
                  pSVar11 = (self_02->iterators).contents;
                  memmove(pSVar11 + uVar17,pSVar11 + uVar17 + 1,(ulong)(uVar15 + ~(uint)uVar17) << 5
                         );
                  puVar1 = &(self_02->iterators).size;
                  *puVar1 = *puVar1 - 1;
                  uVar26 = uVar26 - 1;
                }
              } while ((uint)uVar17 < uVar26);
              uVar26 = (self_02->iterators).size;
              uVar17 = 0;
            } while (uVar26 != 0);
          }
          pSVar6 = (self_02->slices).contents;
          uVar4 = (self_02->slices).size;
          if (uVar4 != 0) {
            ts_stack_renumber_version(self_02,pSVar6->version,uVar21);
            pSVar6->version = uVar21;
          }
          return;
        }
        uVar21 = (self_01->iterators).size;
      }
      (self_01->iterators).contents = pSVar11;
      (self_01->iterators).capacity = 8;
LAB_001304d6:
      pSVar11 = (self_01->iterators).contents;
      (self_01->iterators).size = uVar21 + 1;
      pSVar11[uVar21].node = pSVar5;
      pSVar11[uVar21].subtrees.contents = pSVar12;
      pSVar11[uVar21].subtrees.size = 0;
      pSVar11[uVar21].subtrees.capacity = (uint32_t)uVar17;
      pSVar11[uVar21].subtree_count = 0;
      pSVar11[uVar21].is_pending = true;
      uVar26 = (self_01->iterators).size;
      if (uVar26 != 0) {
        uVar17 = 0;
        do {
          do {
            pSVar11 = (self_01->iterators).contents;
            pSVar5 = pSVar11[uVar17].node;
            uVar21 = (uint)uVar17;
            if (pSVar11[uVar17].subtree_count == extraout_EDX) {
              auStack_f0._0_8_ = pSVar11[uVar17].subtrees.contents;
              pSVar12 = *(Subtree **)&pSVar11[uVar17].subtrees.size;
              auStack_f0._8_4_ = SUB84(pSVar12,0);
              if (1 < (uint)auStack_f0._8_4_) {
                uVar14 = (uint)auStack_f0._8_4_ >> 1;
                uVar20 = 0;
                do {
                  auStack_f0._8_4_ = auStack_f0._8_4_ - 1;
                  SVar19 = *(Subtree *)(auStack_f0._0_8_ + uVar20 * 8);
                  *(Subtree *)(auStack_f0._0_8_ + uVar20 * 8) =
                       *(Subtree *)(auStack_f0._0_8_ + (ulong)(uint)auStack_f0._8_4_ * 8);
                  *(Subtree *)(auStack_f0._0_8_ + (ulong)(uint)auStack_f0._8_4_ * 8) = SVar19;
                  uVar20 = uVar20 + 1;
                } while (uVar14 != uVar20);
              }
              auStack_f0._8_8_ = pSVar12;
              ts_stack__add_slice(self_01,uVar15,pSVar5,(SubtreeArray *)auStack_f0);
LAB_001307b6:
              uVar14 = (self_01->iterators).size;
              if (uVar14 <= uVar21) {
LAB_00130853:
                __assert_fail("index < self->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                              ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
              }
              pSVar11 = (self_01->iterators).contents;
              memmove(pSVar11 + uVar17,pSVar11 + uVar17 + 1,(ulong)(uVar14 + ~uVar21) << 5);
              puVar1 = &(self_01->iterators).size;
              *puVar1 = *puVar1 - 1;
              uVar26 = uVar26 - 1;
            }
            else {
              uVar20 = (ulong)pSVar5->link_count;
              if (pSVar5->link_count == 0) {
                ts_subtree_array_delete(self_01->subtree_pool,&pSVar11[uVar17].subtrees);
                goto LAB_001307b6;
              }
              p_Var18 = &pSVar5->links[1].is_pending;
              uVar25 = 0;
              do {
                uVar25 = uVar25 + 1;
                if (uVar25 == uVar20) {
                  pSVar23 = pSVar5->links[0].node;
                  SVar19 = pSVar5->links[0].subtree;
                  bStack_121 = pSVar5->links[0].is_pending;
                  pSVar11 = (self_01->iterators).contents + uVar17;
LAB_001306a2:
                  pSVar11->node = pSVar23;
                  if (SVar19.ptr == (SubtreeHeapData *)0x0) {
                    pSVar11->subtree_count = pSVar11->subtree_count + 1;
                  }
                  else {
                    if (-1 < (int)extraout_EDX) {
                      uVar14 = (pSVar11->subtrees).size;
                      if (uVar14 == (pSVar11->subtrees).capacity) {
                        uVar24 = uVar14 * 2;
                        if (uVar24 < 9) {
                          uVar24 = 8;
                        }
                        pSVar12 = (pSVar11->subtrees).contents;
                        if (uVar14 < uVar24) {
                          uVar20 = (ulong)uVar24;
                          if (pSVar12 == (Subtree *)0x0) {
                            uStack_d0 = uVar20;
                            pSVar12 = (Subtree *)calloc(uVar20,8);
                            if (pSVar12 == (Subtree *)0x0) goto LAB_0013087a;
                          }
                          else {
                            pSVar12 = (Subtree *)realloc(pSVar12,uVar20 << 3);
                            if (pSVar12 == (Subtree *)0x0) {
                              ts_stack_pop_count_cold_3();
LAB_0013087a:
                              ts_stack_pop_count_cold_4();
                              goto LAB_00130884;
                            }
                            uVar14 = (pSVar11->subtrees).size;
                          }
                          (pSVar11->subtrees).contents = pSVar12;
                          (pSVar11->subtrees).capacity = uVar24;
                        }
                      }
                      else {
                        pSVar12 = (pSVar11->subtrees).contents;
                      }
                      (pSVar11->subtrees).size = uVar14 + 1;
                      pSVar12[uVar14] = SVar19;
                      ts_subtree_retain(SVar19);
                    }
                    if (((ulong)SVar19.ptr & 1) == 0) {
                      uVar14 = *(uint *)&(SVar19.ptr)->field_0x2c >> 2;
                    }
                    else {
                      uVar14 = (uint)((ulong)SVar19.ptr >> 3) & 0x1fffffff;
                    }
                    if (((uVar14 & 1) != 0) ||
                       (pSVar11->subtree_count = pSVar11->subtree_count + 1, (bStack_121 & 1) != 0))
                    goto LAB_0013077e;
                  }
                  pSVar11->is_pending = false;
                }
                else {
                  uVar14 = (self_01->iterators).size;
                  if (uVar14 < 0x40) {
                    pSVar23 = ((StackLink *)(p_Var18 + -0x10))->node;
                    SVar19 = *(Subtree *)(p_Var18 + -8);
                    bStack_121 = *p_Var18;
                    pSVar11 = (self_01->iterators).contents;
                    auStack_f0._0_8_ = pSVar11[uVar17].node;
                    auStack_f0._8_8_ = pSVar11[uVar17].subtrees.contents;
                    pSVar16 = &pSVar11[uVar17].subtrees;
                    uStack_e0._0_4_ = pSVar16->size;
                    uStack_e0._4_4_ = pSVar16->capacity;
                    uStack_d8 = pSVar16[1].contents;
                    if (uVar14 == (self_01->iterators).capacity) {
                      uVar14 = uVar14 * 2;
                      if (uVar14 < 9) {
                        uVar14 = 8;
                      }
                      pSVar11 = (StackIterator *)realloc(pSVar11,(ulong)(uVar14 << 5));
                      if (pSVar11 == (StackIterator *)0x0) {
                        ts_stack_pop_count_cold_2();
                        goto LAB_00130853;
                      }
                      (self_01->iterators).contents = pSVar11;
                      (self_01->iterators).capacity = uVar14;
                      uVar14 = (self_01->iterators).size;
                    }
                    (self_01->iterators).size = uVar14 + 1;
                    pSVar16 = &pSVar11[uVar14].subtrees;
                    pSVar16->size = (undefined4)uStack_e0;
                    pSVar16->capacity = uStack_e0._4_4_;
                    pSVar16[1].contents = uStack_d8;
                    pSVar11[uVar14].node = (StackNode *)auStack_f0._0_8_;
                    pSVar11[uVar14].subtrees.contents = (Subtree *)auStack_f0._8_8_;
                    uVar3 = (self_01->iterators).size;
                    if (uVar3 == 0) {
                      __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                    ,0x151,
                                    "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                                   );
                    }
                    uVar14 = uVar3 - 1;
                    pSVar13 = (self_01->iterators).contents;
                    pSVar11 = pSVar13 + uVar14;
                    pSVar16 = &pSVar13[uVar14].subtrees;
                    ts_subtree_array_copy(*pSVar16,pSVar16);
                    goto LAB_001306a2;
                  }
                }
LAB_0013077e:
                uVar20 = (ulong)pSVar5->link_count;
                p_Var18 = p_Var18 + 0x18;
              } while (uVar25 < uVar20);
              uVar17 = (ulong)(uVar21 + 1);
            }
          } while ((uint)uVar17 < uVar26);
          uVar26 = (self_01->iterators).size;
          uVar17 = 0;
        } while (uVar26 != 0);
      }
      return;
    }
    uVar15 = (self->iterators).size;
  }
  (self->iterators).contents = pSVar11;
  (self->iterators).capacity = 8;
LAB_00130123:
  pSVar11 = (self->iterators).contents;
  (self->iterators).size = uVar15 + 1;
  pSVar11[uVar15].node = pSVar5;
  pSVar16 = &pSVar11[uVar15].subtrees;
  pSVar16->contents = (Subtree *)0x0;
  pSVar16->size = 0;
  pSVar16->capacity = 0;
  pSVar11[uVar15].subtree_count = 0;
  pSVar11[uVar15].is_pending = true;
  uVar26 = (self->iterators).size;
  if (uVar26 != 0) {
    uVar17 = 0;
    do {
      do {
        pSVar11 = (self->iterators).contents;
        uVar15 = (uint)uVar17;
        pSVar5 = pSVar11[uVar17].node;
        (*callback)(payload,pSVar5->state,pSVar11[uVar17].subtree_count);
        uVar20 = (ulong)pSVar5->link_count;
        if (pSVar5->link_count == 0) {
          ts_subtree_array_delete(self->subtree_pool,&pSVar11[uVar17].subtrees);
          uVar21 = (self->iterators).size;
          if (uVar21 <= uVar15) {
LAB_001303cf:
            __assert_fail("index < self->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                          ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
          }
          pSVar11 = (self->iterators).contents;
          memmove(pSVar11 + uVar17,pSVar11 + uVar17 + 1,(ulong)(uVar21 + ~uVar15) << 5);
          puVar1 = &(self->iterators).size;
          *puVar1 = *puVar1 - 1;
          uVar26 = uVar26 - 1;
        }
        else {
          p_Var18 = &pSVar5->links[1].is_pending;
          uVar25 = 0;
          do {
            uVar25 = uVar25 + 1;
            if (uVar25 == uVar20) {
              pSVar23 = pSVar5->links[0].node;
              pSVar22 = pSVar5->links[0].subtree.ptr;
              bVar10 = pSVar5->links[0].is_pending;
              pSVar11 = (self->iterators).contents + uVar17;
LAB_001302c4:
              pSVar11->node = pSVar23;
              if (pSVar22 == (SubtreeHeapData *)0x0) {
                pSVar11->subtree_count = pSVar11->subtree_count + 1;
              }
              else {
                if (((ulong)pSVar22 & 1) == 0) {
                  uVar21 = *(uint *)&pSVar22->field_0x2c >> 2;
                }
                else {
                  uVar21 = (uint)((ulong)pSVar22 >> 3) & 0x1fffffff;
                }
                if (((uVar21 & 1) != 0) ||
                   (pSVar11->subtree_count = pSVar11->subtree_count + 1, (bVar10 & 1) != 0))
                goto LAB_001302fe;
              }
              pSVar11->is_pending = false;
            }
            else {
              uVar21 = (self->iterators).size;
              if (uVar21 < 0x40) {
                pSVar23 = ((StackLink *)(p_Var18 + -0x10))->node;
                pSVar22 = ((Subtree *)(p_Var18 + -8))->ptr;
                bVar10 = *p_Var18;
                pSVar11 = (self->iterators).contents;
                pSVar7 = pSVar11[uVar17].node;
                pSVar12 = pSVar11[uVar17].subtrees.contents;
                pSVar16 = &pSVar11[uVar17].subtrees;
                uVar3 = pSVar16->size;
                uVar9 = pSVar16->capacity;
                uVar8 = pSVar16[1].contents;
                if (uVar21 == (self->iterators).capacity) {
                  uVar21 = uVar21 * 2;
                  if (uVar21 < 9) {
                    uVar21 = 8;
                  }
                  pSVar11 = (StackIterator *)realloc(pSVar11,(ulong)(uVar21 << 5));
                  if (pSVar11 == (StackIterator *)0x0) {
                    ts_stack_iterate_cold_2();
                    goto LAB_001303cf;
                  }
                  (self->iterators).contents = pSVar11;
                  (self->iterators).capacity = uVar21;
                  uVar21 = (self->iterators).size;
                }
                (self->iterators).size = uVar21 + 1;
                pSVar16 = &pSVar11[uVar21].subtrees;
                pSVar16->size = uVar3;
                pSVar16->capacity = uVar9;
                pSVar16[1].contents = uVar8;
                pSVar11[uVar21].node = pSVar7;
                pSVar11[uVar21].subtrees.contents = pSVar12;
                uVar3 = (self->iterators).size;
                if (uVar3 == 0) {
                  __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                ,0x151,
                                "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                               );
                }
                uVar21 = uVar3 - 1;
                pSVar13 = (self->iterators).contents;
                pSVar11 = pSVar13 + uVar21;
                pSVar16 = &pSVar13[uVar21].subtrees;
                ts_subtree_array_copy(*pSVar16,pSVar16);
                goto LAB_001302c4;
              }
            }
LAB_001302fe:
            uVar20 = (ulong)pSVar5->link_count;
            p_Var18 = p_Var18 + 0x18;
          } while (uVar25 < uVar20);
          uVar17 = (ulong)(uVar15 + 1);
        }
      } while ((uint)uVar17 < uVar26);
      uVar26 = (self->iterators).size;
      uVar17 = 0;
    } while (uVar26 != 0);
  }
  return;
}

Assistant:

void ts_stack_iterate(Stack *self, StackVersion version,
                      StackIterateCallback callback, void *payload) {
  StackIterateSession session = {payload, callback};
  stack__iter(self, version, iterate_callback, &session, -1);
}